

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

void __thiscall nuraft::inmem_log_store::inmem_log_store(inmem_log_store *this)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  ptr<buffer> buf;
  undefined4 local_34;
  key_type local_30;
  
  (this->super_log_store)._vptr_log_store = (_func_int **)&PTR__inmem_log_store_00182ee8;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->logs_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->logs_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->logs_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->logs_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->logs_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->start_idx_).super___atomic_base<unsigned_long>._M_i = 1;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header;
  this->raft_server_bwd_pointer_ = (raft_server *)0x0;
  (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i = 0;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->disk_emul_thread_)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->disk_emul_thread_stop_signal_)._M_base._M_i = false;
  EventAwaiter::EventAwaiter(&this->disk_emul_ea_);
  (this->disk_emul_last_durable_index_).super___atomic_base<unsigned_long>._M_i = 0;
  buffer::alloc((buffer *)&buf,8);
  local_34 = 0;
  std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&>
            ((int *)&_Stack_58,(shared_ptr<nuraft::buffer> *)&local_34);
  local_30 = 0;
  this_00 = &std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::operator[](&this->logs_,&local_30)->
             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

inmem_log_store::inmem_log_store()
    : start_idx_(1)
    , raft_server_bwd_pointer_(nullptr)
    , disk_emul_delay(0)
    , disk_emul_thread_(nullptr)
    , disk_emul_thread_stop_signal_(false)
    , disk_emul_last_durable_index_(0)
{
    // Dummy entry for index 0.
    ptr<buffer> buf = buffer::alloc(sz_ulong);
    logs_[0] = cs_new<log_entry>(0, buf);
}